

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanePart.cpp
# Opt level: O1

vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_> * __thiscall
PlanePart::nextPlanePartPossible
          (vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
           *__return_storage_ptr__,PlanePart *this,bool action)

{
  undefined7 in_register_00000011;
  iterator iVar1;
  pair<double,_PlanePart> local_68;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((int)CONCAT71(in_register_00000011,action) == 0) {
    if (this->whichPente == true) {
      local_68.second.frequency = this->frequency + this->pente1;
      local_68.first = 1.0;
      local_68.second.pente0 = 0.1;
      local_68.second.pente1 = 1.0;
      local_68.second.seuil = 3.0;
      local_68.second.probaP0 = 0.9;
      local_68.second.whichPente = true;
      iVar1._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<double,PlanePart>,std::allocator<std::pair<double,PlanePart>>>::
        _M_realloc_insert<std::pair<double,PlanePart>>
                  ((vector<std::pair<double,PlanePart>,std::allocator<std::pair<double,PlanePart>>>
                    *)__return_storage_ptr__,iVar1,&local_68);
        return __return_storage_ptr__;
      }
    }
    else {
      local_68.first = this->probaP0;
      local_68.second.frequency = this->frequency + this->pente0;
      local_68.second.pente0 = 0.1;
      local_68.second.pente1 = 1.0;
      local_68.second.seuil = 3.0;
      local_68.second.probaP0 = 0.9;
      local_68.second.whichPente = false;
      iVar1._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<double,PlanePart>,std::allocator<std::pair<double,PlanePart>>>::
        _M_realloc_insert<std::pair<double,PlanePart>>
                  ((vector<std::pair<double,PlanePart>,std::allocator<std::pair<double,PlanePart>>>
                    *)__return_storage_ptr__,iVar1,&local_68);
      }
      else {
        *(ulong *)&((iVar1._M_current)->second).whichPente =
             (ulong)(uint7)local_68.second._41_7_ << 8;
        ((iVar1._M_current)->second).probaP0 = 0.9;
        ((iVar1._M_current)->second).frequency = local_68.second.frequency;
        ((iVar1._M_current)->second).pente1 = 1.0;
        ((iVar1._M_current)->second).seuil = 3.0;
        (iVar1._M_current)->first = local_68.first;
        ((iVar1._M_current)->second).pente0 = 0.1;
        (__return_storage_ptr__->
        super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_68.first = 1.0 - this->probaP0;
      local_68.second.frequency = this->frequency + this->pente1;
      local_68.second.pente0 = 0.1;
      local_68.second.pente1 = 1.0;
      local_68.second.seuil = 3.0;
      local_68.second.probaP0 = 0.9;
      local_68.second.whichPente = true;
      iVar1._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<double,PlanePart>,std::allocator<std::pair<double,PlanePart>>>::
        _M_realloc_insert<std::pair<double,PlanePart>>
                  ((vector<std::pair<double,PlanePart>,std::allocator<std::pair<double,PlanePart>>>
                    *)__return_storage_ptr__,iVar1,&local_68);
        return __return_storage_ptr__;
      }
    }
  }
  else {
    local_68.second.frequency = this->pente0;
    local_68.first = this->probaP0;
    local_68.second.pente0 = 0.1;
    local_68.second.pente1 = 1.0;
    local_68.second.seuil = 3.0;
    local_68.second.probaP0 = 0.9;
    local_68.second.whichPente = false;
    iVar1._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::pair<double,PlanePart>,std::allocator<std::pair<double,PlanePart>>>::
      _M_realloc_insert<std::pair<double,PlanePart>>
                ((vector<std::pair<double,PlanePart>,std::allocator<std::pair<double,PlanePart>>> *)
                 __return_storage_ptr__,iVar1,&local_68);
    }
    else {
      *(ulong *)&((iVar1._M_current)->second).whichPente = (ulong)(uint7)local_68.second._41_7_ << 8
      ;
      ((iVar1._M_current)->second).probaP0 = 0.9;
      ((iVar1._M_current)->second).frequency = local_68.second.frequency;
      ((iVar1._M_current)->second).pente1 = 1.0;
      ((iVar1._M_current)->second).seuil = 3.0;
      (iVar1._M_current)->first = local_68.first;
      ((iVar1._M_current)->second).pente0 = 0.1;
      (__return_storage_ptr__->
      super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    local_68.first = 1.0 - this->probaP0;
    local_68.second.frequency = this->pente1;
    local_68.second.pente0 = 0.1;
    local_68.second.pente1 = 1.0;
    local_68.second.seuil = 3.0;
    local_68.second.probaP0 = 0.9;
    local_68.second.whichPente = true;
    iVar1._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::pair<double,PlanePart>,std::allocator<std::pair<double,PlanePart>>>::
      _M_realloc_insert<std::pair<double,PlanePart>>
                ((vector<std::pair<double,PlanePart>,std::allocator<std::pair<double,PlanePart>>> *)
                 __return_storage_ptr__,iVar1,&local_68);
      return __return_storage_ptr__;
    }
  }
  *(ulong *)&((iVar1._M_current)->second).whichPente = CONCAT71(local_68.second._41_7_,1);
  ((iVar1._M_current)->second).probaP0 = 0.9;
  ((iVar1._M_current)->second).frequency = local_68.second.frequency;
  ((iVar1._M_current)->second).pente1 = 1.0;
  ((iVar1._M_current)->second).seuil = 3.0;
  (iVar1._M_current)->first = local_68.first;
  ((iVar1._M_current)->second).pente0 = 0.1;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  return __return_storage_ptr__;
}

Assistant:

vector<pair<double,PlanePart>> PlanePart::nextPlanePartPossible(bool action) const {
    vector<pair<double,PlanePart>> PlanePartWithProba;

    // Cas où on ne change pas la pièce
    if (!action) {
        // Cas où l'on est sur la pente haute
        if (whichPente) {
            PlanePartWithProba.push_back(pair<double,PlanePart>(1, PlanePart(frequency + pente1, whichPente)));
        }
        // Cas où l'on est sur la pente basse
        else {
            // On reste sur la pente basse...
            PlanePartWithProba.push_back(pair<double,PlanePart>(probaP0, PlanePart(frequency + pente0, false)));
            // ... ou on bascule sur la pente haute
            PlanePartWithProba.push_back(pair<double,PlanePart>(1 - probaP0, PlanePart(frequency + pente1, true)));
        }
    }

    // Cas où l'n change la pièce
    else {
        // La fréquence est remise à 0 mais un vol est tout de même effectué
        // On reste sur la pente basse...
        PlanePartWithProba.push_back(pair<double,PlanePart>(probaP0, PlanePart(pente0, false)));
        // ... ou on bascule sur la pente haute
        PlanePartWithProba.push_back(pair<double,PlanePart>(1 - probaP0, PlanePart(pente1, true)));
    }

    return PlanePartWithProba;
}